

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O2

void __thiscall
soplex::SPxLPBase<double>::changeMaxObj
          (SPxLPBase<double> *this,VectorBase<double> *newObj,bool scale)

{
  pointer pdVar1;
  undefined7 in_register_00000011;
  ulong uVar2;
  double extraout_XMM0_Qa;
  
  if ((int)CONCAT71(in_register_00000011,scale) != 0) {
    pdVar1 = (this->super_LPColSetBase<double>).object.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    for (uVar2 = 0;
        (long)uVar2 <
        (long)(int)((ulong)((long)(this->super_LPColSetBase<double>).object.val.
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_finish - (long)pdVar1) >> 3);
        uVar2 = uVar2 + 1) {
      (*this->lp_scaler->_vptr_SPxScaler[0x29])
                ((newObj->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar2],this->lp_scaler,this,uVar2 & 0xffffffff);
      pdVar1 = (this->super_LPColSetBase<double>).object.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      pdVar1[uVar2] = extraout_XMM0_Qa;
    }
    return;
  }
  VectorBase<double>::operator=(&(this->super_LPColSetBase<double>).object,newObj);
  return;
}

Assistant:

virtual void changeMaxObj(const VectorBase<R>& newObj, bool scale = false)
   {
      assert(maxObj().dim() == newObj.dim());

      if(scale)
      {
         assert(_isScaled);
         assert(lp_scaler);

         for(int i = 0; i < maxObj().dim(); i++)
            LPColSetBase<R>::maxObj_w(i) = lp_scaler->scaleObj(*this, i, newObj[i]);
      }
      else
         LPColSetBase<R>::maxObj_w() = newObj;

      assert(isConsistent());
   }